

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Generators::
Generators<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>::
populate(Generators<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>
         *this,binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>
               *val)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint128_t uVar5;
  pointer *__ptr;
  GeneratorWrapper<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>
  local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
        )operator_new(0x40);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_00319918;
  lVar1 = *(long *)((long)&(val->a).value + 8);
  lVar2 = *(long *)&val->b;
  lVar3 = *(long *)&val->field_0x18;
  uVar5 = (val->y).value;
  lVar4 = *(long *)((long)&(val->y).value + 8);
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x10) = (long)(val->a).value;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar1;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar2;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar3;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x30) = (long)uVar5;
  *(long *)((long)local_18.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x38) = lVar4;
  std::
  vector<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::optimized_impl::uint128,int,trng::optimized_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::optimized_impl::uint128,int,trng::optimized_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::optimized_impl::uint128,int,trng::optimized_impl::uint128>>>
            ((vector<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::optimized_impl::uint128,int,trng::optimized_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<binary_op_tuple<trng::optimized_impl::uint128,int,trng::optimized_impl::uint128>>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<binary_op_tuple<trng::optimized_impl::uint128,_int,_trng::optimized_impl::uint128>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }